

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcts.h
# Opt level: O0

Move MCTS::compute_move<NimState>(NimState root_state,ComputeOptions options)

{
  double dVar1;
  bool bVar2;
  _Setw _Var3;
  size_type sVar4;
  reference pvVar5;
  reference ppNVar6;
  mapped_type *pmVar7;
  mapped_type_conflict *pmVar8;
  reference ppVar9;
  void *pvVar10;
  ostream *poVar11;
  int in_EDI;
  double dVar12;
  double dVar13;
  int in_stack_00000008;
  byte in_stack_00000018;
  mapped_type best_visits;
  mapped_type_conflict best_wins;
  double expected_success_rate;
  double w;
  double v;
  int move;
  pair<const_int,_int> itr;
  iterator __end0;
  iterator __begin0;
  map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *__range2;
  Move best_move;
  double best_score;
  const_iterator child;
  pointer root;
  int t_2;
  longlong games_played;
  map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_> wins;
  map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> visits;
  int t_1;
  vector<std::unique_ptr<MCTS::Node<NimState>,_std::default_delete<MCTS::Node<NimState>_>_>,_std::allocator<std::unique_ptr<MCTS::Node<NimState>,_std::default_delete<MCTS::Node<NimState>_>_>_>_>
  roots;
  type func;
  int t;
  ComputeOptions job_options;
  vector<std::future<std::unique_ptr<MCTS::Node<NimState>,_std::default_delete<MCTS::Node<NimState>_>_>_>,_std::allocator<std::future<std::unique_ptr<MCTS::Node<NimState>,_std::default_delete<MCTS::Node<NimState>_>_>_>_>_>
  root_futures;
  vector<int,_std::allocator<int>_> moves;
  map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
  *in_stack_fffffffffffffd48;
  vector<std::future<std::unique_ptr<MCTS::Node<NimState>,_std::default_delete<MCTS::Node<NimState>_>_>_>,_std::allocator<std::future<std::unique_ptr<MCTS::Node<NimState>,_std::default_delete<MCTS::Node<NimState>_>_>_>_>_>
  *in_stack_fffffffffffffd50;
  ostream *in_stack_fffffffffffffd60;
  future<std::unique_ptr<MCTS::Node<NimState>,_std::default_delete<MCTS::Node<NimState>_>_>_>
  *in_stack_fffffffffffffd78;
  NimState *in_stack_fffffffffffffd88;
  map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
  *in_stack_fffffffffffffd90;
  undefined4 in_stack_fffffffffffffdc0;
  undefined4 in_stack_fffffffffffffdc4;
  undefined8 in_stack_fffffffffffffdc8;
  int local_178;
  int iStack_174;
  _Self local_170;
  _Self local_168;
  undefined1 *local_160;
  Move local_154;
  double local_150;
  Node<NimState> **local_148;
  __normal_iterator<MCTS::Node<NimState>_*const_*,_std::vector<MCTS::Node<NimState>_*,_std::allocator<MCTS::Node<NimState>_*>_>_>
  local_140;
  pointer local_138;
  int local_12c;
  long local_128;
  undefined1 local_f0 [60];
  int local_b4;
  vector<std::unique_ptr<MCTS::Node<NimState>,_std::default_delete<MCTS::Node<NimState>_>_>,_std::allocator<std::unique_ptr<MCTS::Node<NimState>,_std::default_delete<MCTS::Node<NimState>_>_>_>_>
  local_b0;
  int local_88;
  undefined1 *local_80;
  undefined1 *local_78;
  int local_6c;
  undefined1 local_68 [12];
  int iVar14;
  char *in_stack_ffffffffffffffa8;
  pointer in_stack_ffffffffffffffb0;
  vector<int,_std::allocator<int>_> local_28;
  undefined1 local_c [8];
  Move local_4;
  
  iVar14 = (int)((ulong)stack0xffffffffffffffa0 >> 0x20);
  if ((in_EDI != 1) && (in_EDI != 2)) {
    assertion_failed((char *)in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,iVar14);
  }
  NimState::get_moves(in_stack_fffffffffffffd88);
  sVar4 = std::vector<int,_std::allocator<int>_>::size(&local_28);
  if (sVar4 == 0) {
    assertion_failed((char *)in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,iVar14);
  }
  sVar4 = std::vector<int,_std::allocator<int>_>::size(&local_28);
  if (sVar4 == 1) {
    pvVar5 = std::vector<int,_std::allocator<int>_>::operator[](&local_28,0);
    local_4 = *pvVar5;
  }
  else {
    std::
    vector<std::future<std::unique_ptr<MCTS::Node<NimState>,_std::default_delete<MCTS::Node<NimState>_>_>_>,_std::allocator<std::future<std::unique_ptr<MCTS::Node<NimState>,_std::default_delete<MCTS::Node<NimState>_>_>_>_>_>
    ::vector((vector<std::future<std::unique_ptr<MCTS::Node<NimState>,_std::default_delete<MCTS::Node<NimState>_>_>_>,_std::allocator<std::future<std::unique_ptr<MCTS::Node<NimState>,_std::default_delete<MCTS::Node<NimState>_>_>_>_>_>
              *)0x125c72);
    for (local_6c = 0; local_6c < in_stack_00000008; local_6c = local_6c + 1) {
      local_88 = local_6c;
      local_80 = local_c;
      local_78 = local_68;
      std::async<MCTS::compute_move<NimState>(NimState,MCTS::ComputeOptions)::_lambda()_1_&>
                ((launch)((ulong)in_stack_fffffffffffffdc8 >> 0x20),
                 (type *)CONCAT44(in_stack_fffffffffffffdc4,in_stack_fffffffffffffdc0));
      std::
      vector<std::future<std::unique_ptr<MCTS::Node<NimState>,_std::default_delete<MCTS::Node<NimState>_>_>_>,_std::allocator<std::future<std::unique_ptr<MCTS::Node<NimState>,_std::default_delete<MCTS::Node<NimState>_>_>_>_>_>
      ::push_back(in_stack_fffffffffffffd50,(value_type *)in_stack_fffffffffffffd48);
      std::
      future<std::unique_ptr<MCTS::Node<NimState>,_std::default_delete<MCTS::Node<NimState>_>_>_>::
      ~future((future<std::unique_ptr<MCTS::Node<NimState>,_std::default_delete<MCTS::Node<NimState>_>_>_>
               *)0x125d35);
    }
    std::
    vector<std::unique_ptr<MCTS::Node<NimState>,_std::default_delete<MCTS::Node<NimState>_>_>,_std::allocator<std::unique_ptr<MCTS::Node<NimState>,_std::default_delete<MCTS::Node<NimState>_>_>_>_>
    ::vector((vector<std::unique_ptr<MCTS::Node<NimState>,_std::default_delete<MCTS::Node<NimState>_>_>,_std::allocator<std::unique_ptr<MCTS::Node<NimState>,_std::default_delete<MCTS::Node<NimState>_>_>_>_>
              *)0x125d97);
    for (local_b4 = 0; local_b4 < in_stack_00000008; local_b4 = local_b4 + 1) {
      std::
      vector<std::future<std::unique_ptr<MCTS::Node<NimState>,_std::default_delete<MCTS::Node<NimState>_>_>_>,_std::allocator<std::future<std::unique_ptr<MCTS::Node<NimState>,_std::default_delete<MCTS::Node<NimState>_>_>_>_>_>
      ::operator[]((vector<std::future<std::unique_ptr<MCTS::Node<NimState>,_std::default_delete<MCTS::Node<NimState>_>_>_>,_std::allocator<std::future<std::unique_ptr<MCTS::Node<NimState>,_std::default_delete<MCTS::Node<NimState>_>_>_>_>_>
                    *)&stack0xffffffffffffffb0,(long)local_b4);
      std::
      future<std::unique_ptr<MCTS::Node<NimState>,_std::default_delete<MCTS::Node<NimState>_>_>_>::
      get(in_stack_fffffffffffffd78);
      std::
      vector<std::unique_ptr<MCTS::Node<NimState>,_std::default_delete<MCTS::Node<NimState>_>_>,_std::allocator<std::unique_ptr<MCTS::Node<NimState>,_std::default_delete<MCTS::Node<NimState>_>_>_>_>
      ::push_back((vector<std::unique_ptr<MCTS::Node<NimState>,_std::default_delete<MCTS::Node<NimState>_>_>,_std::allocator<std::unique_ptr<MCTS::Node<NimState>,_std::default_delete<MCTS::Node<NimState>_>_>_>_>
                   *)in_stack_fffffffffffffd50,(value_type *)in_stack_fffffffffffffd48);
      std::unique_ptr<MCTS::Node<NimState>,_std::default_delete<MCTS::Node<NimState>_>_>::
      ~unique_ptr((unique_ptr<MCTS::Node<NimState>,_std::default_delete<MCTS::Node<NimState>_>_> *)
                  in_stack_fffffffffffffd50);
    }
    std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::map
              ((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *)
               0x125e63);
    std::map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>::map
              ((map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_> *)
               0x125e70);
    local_128 = 0;
    for (local_12c = 0; local_12c < in_stack_00000008; local_12c = local_12c + 1) {
      std::
      vector<std::unique_ptr<MCTS::Node<NimState>,_std::default_delete<MCTS::Node<NimState>_>_>,_std::allocator<std::unique_ptr<MCTS::Node<NimState>,_std::default_delete<MCTS::Node<NimState>_>_>_>_>
      ::operator[](&local_b0,(long)local_12c);
      local_138 = std::unique_ptr<MCTS::Node<NimState>,_std::default_delete<MCTS::Node<NimState>_>_>
                  ::get((unique_ptr<MCTS::Node<NimState>,_std::default_delete<MCTS::Node<NimState>_>_>
                         *)in_stack_fffffffffffffd50);
      local_128 = local_138->visits + local_128;
      local_140._M_current =
           (Node<NimState> **)
           std::vector<MCTS::Node<NimState>_*,_std::allocator<MCTS::Node<NimState>_*>_>::cbegin
                     ((vector<MCTS::Node<NimState>_*,_std::allocator<MCTS::Node<NimState>_*>_> *)
                      in_stack_fffffffffffffd48);
      while( true ) {
        local_148 = (Node<NimState> **)
                    std::vector<MCTS::Node<NimState>_*,_std::allocator<MCTS::Node<NimState>_*>_>::
                    cend((vector<MCTS::Node<NimState>_*,_std::allocator<MCTS::Node<NimState>_*>_> *)
                         in_stack_fffffffffffffd48);
        bVar2 = __gnu_cxx::operator!=
                          ((__normal_iterator<MCTS::Node<NimState>_*const_*,_std::vector<MCTS::Node<NimState>_*,_std::allocator<MCTS::Node<NimState>_*>_>_>
                            *)in_stack_fffffffffffffd50,
                           (__normal_iterator<MCTS::Node<NimState>_*const_*,_std::vector<MCTS::Node<NimState>_*,_std::allocator<MCTS::Node<NimState>_*>_>_>
                            *)in_stack_fffffffffffffd48);
        if (!bVar2) break;
        ppNVar6 = __gnu_cxx::
                  __normal_iterator<MCTS::Node<NimState>_*const_*,_std::vector<MCTS::Node<NimState>_*,_std::allocator<MCTS::Node<NimState>_*>_>_>
                  ::operator*(&local_140);
        iVar14 = (*ppNVar6)->visits;
        __gnu_cxx::
        __normal_iterator<MCTS::Node<NimState>_*const_*,_std::vector<MCTS::Node<NimState>_*,_std::allocator<MCTS::Node<NimState>_*>_>_>
        ::operator*(&local_140);
        pmVar7 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
                 operator[](in_stack_fffffffffffffd90,&in_stack_fffffffffffffd88->player_to_move);
        *pmVar7 = *pmVar7 + iVar14;
        ppNVar6 = __gnu_cxx::
                  __normal_iterator<MCTS::Node<NimState>_*const_*,_std::vector<MCTS::Node<NimState>_*,_std::allocator<MCTS::Node<NimState>_*>_>_>
                  ::operator*(&local_140);
        dVar1 = (*ppNVar6)->wins;
        __gnu_cxx::
        __normal_iterator<MCTS::Node<NimState>_*const_*,_std::vector<MCTS::Node<NimState>_*,_std::allocator<MCTS::Node<NimState>_*>_>_>
        ::operator*(&local_140);
        pmVar8 = std::
                 map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>::
                 operator[]((map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
                             *)in_stack_fffffffffffffd90,&in_stack_fffffffffffffd88->player_to_move)
        ;
        *pmVar8 = dVar1 + *pmVar8;
        __gnu_cxx::
        __normal_iterator<MCTS::Node<NimState>_*const_*,_std::vector<MCTS::Node<NimState>_*,_std::allocator<MCTS::Node<NimState>_*>_>_>
        ::operator++(&local_140);
      }
    }
    local_150 = -1.0;
    local_154 = 0;
    local_160 = local_f0;
    local_168._M_node =
         (_Base_ptr)
         std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::begin
                   (in_stack_fffffffffffffd48);
    local_170._M_node =
         (_Base_ptr)
         std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::end
                   (in_stack_fffffffffffffd48);
    while( true ) {
      bVar2 = std::operator!=(&local_168,&local_170);
      if (!bVar2) break;
      ppVar9 = std::_Rb_tree_iterator<std::pair<const_int,_int>_>::operator*
                         ((_Rb_tree_iterator<std::pair<const_int,_int>_> *)0x1260d1);
      local_178 = (*ppVar9).first;
      iStack_174 = (*ppVar9).second;
      dVar12 = (double)iStack_174;
      pmVar8 = std::map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
               ::operator[]((map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
                             *)in_stack_fffffffffffffd90,&in_stack_fffffffffffffd88->player_to_move)
      ;
      dVar1 = *pmVar8;
      dVar13 = (dVar1 + 1.0) / (dVar12 + 2.0);
      if (local_150 < dVar13) {
        local_154 = local_178;
        local_150 = dVar13;
      }
      if ((in_stack_00000018 & 1) != 0) {
        poVar11 = std::operator<<((ostream *)&std::cerr,"Move: ");
        poVar11 = (ostream *)std::ostream::operator<<(poVar11,local_178);
        poVar11 = std::operator<<(poVar11," (");
        _Var3 = std::setw(2);
        poVar11 = std::operator<<(poVar11,_Var3);
        pvVar10 = (void *)std::ostream::operator<<(poVar11,std::right);
        poVar11 = (ostream *)
                  std::ostream::operator<<
                            (pvVar10,(int)((dVar12 * 100.0) / (double)local_128 + 0.5));
        poVar11 = std::operator<<(poVar11,"% visits)");
        poVar11 = std::operator<<(poVar11," (");
        _Var3 = std::setw(2);
        poVar11 = std::operator<<(poVar11,_Var3);
        pvVar10 = (void *)std::ostream::operator<<(poVar11,std::right);
        poVar11 = (ostream *)std::ostream::operator<<(pvVar10,(int)((dVar1 * 100.0) / dVar12 + 0.5))
        ;
        poVar11 = std::operator<<(poVar11,"% wins)");
        std::ostream::operator<<(poVar11,std::endl<char,std::char_traits<char>>);
      }
      std::_Rb_tree_iterator<std::pair<const_int,_int>_>::operator++
                ((_Rb_tree_iterator<std::pair<const_int,_int>_> *)in_stack_fffffffffffffd50);
    }
    if ((in_stack_00000018 & 1) != 0) {
      pmVar8 = std::map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
               ::operator[]((map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
                             *)in_stack_fffffffffffffd90,&in_stack_fffffffffffffd88->player_to_move)
      ;
      dVar1 = *pmVar8;
      pmVar7 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
               operator[](in_stack_fffffffffffffd90,&in_stack_fffffffffffffd88->player_to_move);
      iVar14 = *pmVar7;
      poVar11 = std::operator<<((ostream *)&std::cerr,"----");
      std::ostream::operator<<(poVar11,std::endl<char,std::char_traits<char>>);
      poVar11 = std::operator<<((ostream *)&std::cerr,"Best: ");
      poVar11 = (ostream *)std::ostream::operator<<(poVar11,local_154);
      poVar11 = std::operator<<(poVar11," (");
      poVar11 = (ostream *)
                std::ostream::operator<<(poVar11,((double)iVar14 * 100.0) / (double)local_128);
      in_stack_fffffffffffffd60 = std::operator<<(poVar11,"% visits)");
      poVar11 = std::operator<<(in_stack_fffffffffffffd60," (");
      poVar11 = (ostream *)std::ostream::operator<<(poVar11,(dVar1 * 100.0) / (double)iVar14);
      poVar11 = std::operator<<(poVar11,"% wins)");
      std::ostream::operator<<(poVar11,std::endl<char,std::char_traits<char>>);
    }
    local_4 = local_154;
    std::map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>::~map
              ((map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_> *)
               0x12657c);
    std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::~map
              ((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *)
               0x126589);
    std::
    vector<std::unique_ptr<MCTS::Node<NimState>,_std::default_delete<MCTS::Node<NimState>_>_>,_std::allocator<std::unique_ptr<MCTS::Node<NimState>,_std::default_delete<MCTS::Node<NimState>_>_>_>_>
    ::~vector((vector<std::unique_ptr<MCTS::Node<NimState>,_std::default_delete<MCTS::Node<NimState>_>_>,_std::allocator<std::unique_ptr<MCTS::Node<NimState>,_std::default_delete<MCTS::Node<NimState>_>_>_>_>
               *)in_stack_fffffffffffffd60);
    std::
    vector<std::future<std::unique_ptr<MCTS::Node<NimState>,_std::default_delete<MCTS::Node<NimState>_>_>_>,_std::allocator<std::future<std::unique_ptr<MCTS::Node<NimState>,_std::default_delete<MCTS::Node<NimState>_>_>_>_>_>
    ::~vector((vector<std::future<std::unique_ptr<MCTS::Node<NimState>,_std::default_delete<MCTS::Node<NimState>_>_>_>,_std::allocator<std::future<std::unique_ptr<MCTS::Node<NimState>,_std::default_delete<MCTS::Node<NimState>_>_>_>_>_>
               *)in_stack_fffffffffffffd60);
  }
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffd60);
  return local_4;
}

Assistant:

typename State::Move compute_move(const State root_state,
                                  const ComputeOptions options)
{
	using namespace std;

	// Will support more players later.
	attest(root_state.player_to_move == 1 || root_state.player_to_move == 2);

	auto moves = root_state.get_moves();
	attest(moves.size() > 0);
	if (moves.size() == 1) {
		return moves[0];
	}

	#ifdef USE_OPENMP
	double start_time = ::omp_get_wtime();
	#endif

	// Start all jobs to compute trees.
	vector<future<unique_ptr<Node<State>>>> root_futures;
	ComputeOptions job_options = options;
	job_options.verbose = false;
	for (int t = 0; t < options.number_of_threads; ++t) {
		auto func = [t, &root_state, &job_options] () -> std::unique_ptr<Node<State>>
		{
			return compute_tree(root_state, job_options, 1012411 * t + 12515);
		};

		root_futures.push_back(std::async(std::launch::async, func));
	}

	// Collect the results.
	vector<unique_ptr<Node<State>>> roots;
	for (int t = 0; t < options.number_of_threads; ++t) {
		roots.push_back(std::move(root_futures[t].get()));
	}

	// Merge the children of all root nodes.
	map<typename State::Move, int> visits;
	map<typename State::Move, double> wins;
	long long games_played = 0;
	for (int t = 0; t < options.number_of_threads; ++t) {
		auto root = roots[t].get();
		games_played += root->visits;
		for (auto child = root->children.cbegin(); child != root->children.cend(); ++child) {
			visits[(*child)->move] += (*child)->visits;
			wins[(*child)->move]   += (*child)->wins;
		}
	}

	// Find the node with the highest score.
	double best_score = -1;
	typename State::Move best_move = typename State::Move();
	for (auto itr: visits) {
		auto move = itr.first;
		double v = itr.second;
		double w = wins[move];
		// Expected success rate assuming a uniform prior (Beta(1, 1)).
		// https://en.wikipedia.org/wiki/Beta_distribution
		double expected_success_rate = (w + 1) / (v + 2);
		if (expected_success_rate > best_score) {
			best_move = move;
			best_score = expected_success_rate;
		}

		if (options.verbose) {
			cerr << "Move: " << itr.first
			     << " (" << setw(2) << right << int(100.0 * v / double(games_played) + 0.5) << "% visits)"
			     << " (" << setw(2) << right << int(100.0 * w / v + 0.5)    << "% wins)" << endl;
		}
	}

	if (options.verbose) {
		auto best_wins = wins[best_move];
		auto best_visits = visits[best_move];
		cerr << "----" << endl;
		cerr << "Best: " << best_move
		     << " (" << 100.0 * best_visits / double(games_played) << "% visits)"
		     << " (" << 100.0 * best_wins / best_visits << "% wins)" << endl;
	}

	#ifdef USE_OPENMP
	if (options.verbose) {
		double time = ::omp_get_wtime();
		std::cerr << games_played << " games played in " << double(time - start_time) << " s. "
		          << "(" << double(games_played) / (time - start_time) << " / second, "
		          << options.number_of_threads << " parallel jobs)." << endl;
	}
	#endif

	return best_move;
}